

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O0

string * to_string_abi_cxx11_(ze_device_type_t val)

{
  undefined4 in_ESI;
  undefined4 in_register_0000003c;
  string *this;
  ze_device_type_t val_local;
  string *str;
  
  this = (string *)CONCAT44(in_register_0000003c,val);
  std::__cxx11::string::string(this);
  switch(in_ESI) {
  case 1:
    std::__cxx11::string::operator=(this,"ZE_DEVICE_TYPE_GPU");
    break;
  case 2:
    std::__cxx11::string::operator=(this,"ZE_DEVICE_TYPE_CPU");
    break;
  case 3:
    std::__cxx11::string::operator=(this,"ZE_DEVICE_TYPE_FPGA");
    break;
  case 4:
    std::__cxx11::string::operator=(this,"ZE_DEVICE_TYPE_MCA");
    break;
  default:
    std::__cxx11::string::operator=(this,"?");
  }
  return this;
}

Assistant:

std::string to_string( const ze_device_type_t val )
{
    std::string str;

    switch( val )
    {
    case ZE_DEVICE_TYPE_GPU:
        str = "ZE_DEVICE_TYPE_GPU";
        break;

    case ZE_DEVICE_TYPE_CPU:
        str = "ZE_DEVICE_TYPE_CPU";
        break;

    case ZE_DEVICE_TYPE_FPGA:
        str = "ZE_DEVICE_TYPE_FPGA";
        break;

    case ZE_DEVICE_TYPE_MCA:
        str = "ZE_DEVICE_TYPE_MCA";
        break;

    default:
        str = "?";
        break;
    };

    return str;
}